

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_llist.c
# Opt level: O0

void ares_llist_node_destroy(ares_llist_node_t *node)

{
  ares_llist_destructor_t p_Var1;
  void *pvVar2;
  void *val;
  ares_llist_destructor_t destruct;
  ares_llist_node_t *node_local;
  
  if (node != (ares_llist_node_t *)0x0) {
    p_Var1 = node->parent->destruct;
    pvVar2 = ares_llist_node_claim(node);
    if ((pvVar2 != (void *)0x0) && (p_Var1 != (ares_llist_destructor_t)0x0)) {
      (*p_Var1)(pvVar2);
    }
  }
  return;
}

Assistant:

void ares_llist_node_destroy(ares_llist_node_t *node)
{
  ares_llist_destructor_t destruct;
  void                   *val;

  if (node == NULL) {
    return;
  }

  destruct = node->parent->destruct;

  val = ares_llist_node_claim(node);
  if (val != NULL && destruct != NULL) {
    destruct(val);
  }
}